

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::PrivateToLocalPass::UpdateUses(PrivateToLocalPass *this,Instruction *inst)

{
  IRContext *this_00;
  undefined8 *puVar1;
  bool bVar2;
  uint32_t id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  undefined8 *puVar3;
  bool bVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  undefined8 *local_68;
  undefined8 *puStack_60;
  long local_58;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  id = 0;
  if (inst->has_result_id_ == true) {
    id = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_58 = 0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:225:11)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:225:11)>
             ::_M_manager;
  local_48._M_unused._M_object = &local_68;
  analysis::DefUseManager::ForEachUser
            ((this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,id
             ,(function<void_(spvtools::opt::Instruction_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  puVar1 = puStack_60;
  puVar3 = local_68;
  bVar4 = local_68 == puStack_60;
  if ((!bVar4) && (bVar2 = UpdateUse(this,(Instruction *)*local_68,inst), bVar2)) {
    do {
      puVar3 = puVar3 + 1;
      bVar4 = puVar3 == puVar1;
      if (bVar4) break;
      bVar2 = UpdateUse(this,(Instruction *)*puVar3,inst);
    } while (bVar2);
  }
  if (local_68 != (undefined8 *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return bVar4;
}

Assistant:

bool PrivateToLocalPass::UpdateUses(Instruction* inst) {
  uint32_t id = inst->result_id();
  std::vector<Instruction*> uses;
  context()->get_def_use_mgr()->ForEachUser(
      id, [&uses](Instruction* use) { uses.push_back(use); });

  for (Instruction* use : uses) {
    if (!UpdateUse(use, inst)) {
      return false;
    }
  }
  return true;
}